

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O3

int asio_service_test::message_meta_random_denial_test(void)

{
  RaftAsioPkg *pRVar1;
  long lVar2;
  bool bVar3;
  __atomic_base<unsigned_long> logs;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int __how;
  int __how_00;
  ulong __val;
  char cVar8;
  int iVar9;
  string *psVar10;
  RaftAsioPkg *pRVar11;
  pointer ppRVar12;
  ostream *poVar13;
  initializer_list<RaftAsioPkg_*> __l;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l_00;
  atomic<bool> start_denial;
  string msg_str;
  buffer_serializer bs;
  ptr<buffer> msg;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  atomic<unsigned_long> write_resp_cb_count;
  atomic<unsigned_long> write_req_cb_count;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  RaftAsioPkg s1;
  RaftAsioPkg s3;
  RaftAsioPkg s2;
  undefined1 local_549;
  undefined1 local_548 [32];
  _Invoker_type p_Stack_528;
  undefined2 local_520;
  allocator_type local_511;
  buffer_serializer local_510;
  _Any_data local_4f8;
  code *local_4e8;
  code *pcStack_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *pcStack_4c0;
  shared_ptr<nuraft::buffer> local_4b0;
  _Any_data local_4a0;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> local_490;
  _Any_data local_478;
  code *local_468;
  code *pcStack_460;
  _Any_data local_458;
  code *local_448;
  code *pcStack_440;
  pointer local_430;
  element_type *local_428;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_420;
  undefined1 *local_418;
  long local_410;
  undefined1 local_408 [16];
  undefined1 *local_3f8;
  long local_3f0;
  undefined1 local_3e8 [16];
  undefined1 *local_3d8;
  long local_3d0;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [40];
  undefined1 local_390 [8];
  _Alloc_hider local_388;
  char local_378 [16];
  undefined1 local_368 [64];
  __atomic_base<unsigned_long> local_328;
  __native_type local_298;
  undefined1 local_270 [8];
  _Alloc_hider local_268;
  char local_258 [16];
  undefined1 local_248 [64];
  raft_server *local_208;
  undefined2 local_178;
  bool local_176;
  element_type *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_168;
  element_type *local_160;
  __node_base _Stack_158;
  undefined1 local_150 [8];
  _Alloc_hider local_148;
  char local_138 [16];
  undefined1 local_128 [64];
  raft_server *local_e8;
  undefined2 local_58;
  bool local_56;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  raft_functional_common::reset_log_files();
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"127.0.0.1:20010","");
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"127.0.0.1:20020","");
  local_418 = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"127.0.0.1:20030","");
  local_390._0_4_ = 1;
  local_388._M_p = local_378;
  std::__cxx11::string::_M_construct<char*>((string *)&local_388,local_3d8,local_3d8 + local_3d0);
  memset(local_368,0,0xd0);
  local_298.__data.__lock._0_2_ = 1;
  local_298.__size[2] = '\0';
  local_298._8_8_ = 0;
  local_298._16_8_ = 0;
  local_298.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_298.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_150._0_4_ = 2;
  local_148._M_p = local_138;
  std::__cxx11::string::_M_construct<char*>((string *)&local_148,local_3f8,local_3f8 + local_3f0);
  memset(local_128,0,0xd0);
  local_58._0_1_ = true;
  local_58._1_1_ = false;
  local_56 = false;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = (__pthread_internal_list *)0x0;
  local_270._0_4_ = 3;
  local_268._M_p = local_258;
  std::__cxx11::string::_M_construct<char*>((string *)&local_268,local_418,local_418 + local_410);
  memset(local_248,0,0xd0);
  local_178._0_1_ = true;
  local_178._1_1_ = false;
  local_176 = false;
  local_170 = (element_type *)0x0;
  _Stack_168._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_160 = (element_type *)0x0;
  _Stack_158._M_nxt = (_Hash_node_base *)0x0;
  local_548._0_8_ = local_390;
  local_548._8_8_ = local_150;
  local_548._16_8_ = local_270;
  __l._M_len = 3;
  __l._M_array = (iterator)local_548;
  std::vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>::vector
            (&local_490,__l,(allocator_type *)&local_510);
  local_420._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_428 = (element_type *)0x0;
  local_549 = 0;
  TestSuite::_msg("launching asio-raft servers with meta callback\n");
  local_430 = local_490.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_490.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_490.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppRVar12 = local_490.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pRVar1 = *ppRVar12;
      local_4c8 = (code *)0x0;
      pcStack_4c0 = (code *)0x0;
      local_4d8._M_unused._M_object = (void *)0x0;
      local_4d8._8_8_ = 0;
      local_4d8._M_unused._M_object = operator_new(0x10);
      *(code **)local_4d8._M_unused._0_8_ = test_read_meta_random_denial;
      *(undefined1 **)((long)local_4d8._M_unused._0_8_ + 8) = &local_549;
      pcStack_4c0 = std::
                    _Function_handler<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<bool_(*(std::atomic<bool>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<bool>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    ::_M_invoke;
      local_4c8 = std::
                  _Function_handler<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<bool_(*(std::atomic<bool>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<bool>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                  ::_M_manager;
      local_4f8._M_unused._M_object = (void *)0x0;
      local_4f8._8_8_ = 0;
      local_4e8 = (code *)0x0;
      pcStack_4e0 = (code *)0x0;
      local_4f8._M_unused._M_object = operator_new(0x10);
      *(code **)local_4f8._M_unused._0_8_ = test_write_req_meta_abi_cxx11_;
      *(__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)local_4f8._M_unused._0_8_ + 8) =
           &local_420;
      pcStack_4e0 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&),_std::_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>_>
                    ::_M_invoke;
      local_4e8 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&),_std::_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>_>
                  ::_M_manager;
      local_458._M_unused._M_object = (void *)0x0;
      local_458._8_8_ = 0;
      local_448 = (code *)0x0;
      pcStack_440 = (code *)0x0;
      local_458._M_unused._M_object = operator_new(0x10);
      *(code **)local_458._M_unused._0_8_ = test_read_meta_random_denial;
      *(undefined1 **)((long)local_458._M_unused._0_8_ + 8) = &local_549;
      pcStack_440 = std::
                    _Function_handler<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<bool_(*(std::atomic<bool>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<bool>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    ::_M_invoke;
      local_448 = std::
                  _Function_handler<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::_Bind<bool_(*(std::atomic<bool>_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::atomic<bool>_*,_const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                  ::_M_manager;
      local_478._M_unused._M_object = (void *)0x0;
      local_478._8_8_ = 0;
      local_468 = (code *)0x0;
      pcStack_460 = (code *)0x0;
      local_478._M_unused._M_object = operator_new(0x10);
      *(code **)local_478._M_unused._0_8_ = test_write_resp_meta_abi_cxx11_;
      *(element_type ***)((long)local_478._M_unused._0_8_ + 8) = &local_428;
      pcStack_460 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&),_std::_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>_>
                    ::_M_invoke;
      local_468 = std::
                  _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&),_std::_Bind<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*(std::atomic<unsigned_long>_*,_std::_Placeholder<1>))(std::atomic<unsigned_long>_*,_const_nuraft::asio_service_meta_cb_params_&)>_>
                  ::_M_manager;
      RaftAsioPkg::setMetaCallback
                (pRVar1,(READ_META_FUNC *)&local_4d8,(WRITE_META_FUNC *)&local_4f8,
                 (READ_META_FUNC *)&local_458,(WRITE_META_FUNC *)&local_478,true);
      if (local_468 != (code *)0x0) {
        (*local_468)(&local_478,&local_478,__destroy_functor);
      }
      if (local_448 != (code *)0x0) {
        (*local_448)(&local_458,&local_458,__destroy_functor);
      }
      if (local_4e8 != (code *)0x0) {
        (*local_4e8)(&local_4f8,&local_4f8,3);
      }
      if (local_4c8 != (code *)0x0) {
        (*local_4c8)(&local_4d8,&local_4d8,3);
      }
      ppRVar12 = ppRVar12 + 1;
    } while (ppRVar12 != local_430);
  }
  local_548._0_8_ = local_548._0_8_ & 0xffffffffffffff00;
  local_548._8_8_ = (void *)0x0;
  local_548._16_8_ = 0;
  local_548._24_8_ = (_Manager_type)0x0;
  p_Stack_528 = (_Invoker_type)0x0;
  local_520._0_1_ = true;
  local_520._1_1_ = false;
  iVar5 = launch_servers(&local_490,false,false,true,(init_options *)local_548);
  if ((_Manager_type)local_548._24_8_ != (_Manager_type)0x0) {
    (*(code *)local_548._24_8_)(local_548 + 8,local_548 + 8,3);
  }
  if (iVar5 == 0) {
    TestSuite::_msg("organizing raft group\n");
    iVar5 = make_group(&local_490);
    if (iVar5 == 0) {
      pRVar1 = (RaftAsioPkg *)(local_548 + 0x10);
      local_548._0_8_ = pRVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_548,"wait for Raft group ready","");
      TestSuite::sleep_sec(1,(string *)local_548);
      if ((RaftAsioPkg *)local_548._0_8_ != pRVar1) {
        operator_delete((void *)local_548._0_8_);
      }
      if (((((atomic<int> *)(local_328._M_i + 0x34))->super___atomic_base<int>)._M_i ==
           *(int *)(local_328._M_i + 0x38)) &&
         (((atomic<nuraft::srv_role> *)(local_328._M_i + 0x2c8))->_M_i == 3)) {
        if ((((((atomic<int> *)(local_328._M_i + 0x34))->super___atomic_base<int>)._M_i ==
              *(int *)(local_328._M_i + 0x38)) &&
            (iVar5 = -1, ((atomic<nuraft::srv_role> *)(local_328._M_i + 0x2c8))->_M_i != 3)) ||
           (iVar5 = (((atomic<int> *)(local_328._M_i + 0x34))->super___atomic_base<int>)._M_i,
           iVar5 != 1)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          poVar6 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_548._0_8_,local_548._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
          lVar2 = *(long *)poVar6;
          *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
          poVar13 = poVar6 + *(long *)(lVar2 + -0x18);
          if (poVar6[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar13);
            poVar13[0xe1] = (ostream)0x1;
          }
          poVar13[0xe0] = (ostream)0x30;
          local_510._0_8_ = pthread_self();
          std::_Hash_bytes(&local_510,8,0xc70f6907);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"message_meta_random_denial_test",0x1f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"    value of: \x1b[1;34ms1.raftServer->get_leader()\x1b[0m\n",0x35);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15)
          ;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15)
          ;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
          if ((RaftAsioPkg *)local_548._0_8_ != pRVar1) {
            operator_delete((void *)local_548._0_8_);
          }
          iVar5 = -1;
          TestSuite::failHandler();
        }
        else if ((((local_e8->leader_).super___atomic_base<int>._M_i == local_e8->id_) &&
                 (iVar5 = -1, (local_e8->role_)._M_i != leader)) ||
                (iVar5 = (local_e8->leader_).super___atomic_base<int>._M_i, iVar5 != 1)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          poVar6 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_548._0_8_,local_548._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
          lVar2 = *(long *)poVar6;
          *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
          poVar13 = poVar6 + *(long *)(lVar2 + -0x18);
          if (poVar6[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar13);
            poVar13[0xe1] = (ostream)0x1;
          }
          poVar13[0xe0] = (ostream)0x30;
          local_510._0_8_ = pthread_self();
          std::_Hash_bytes(&local_510,8,0xc70f6907);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"message_meta_random_denial_test",0x1f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"    value of: \x1b[1;34ms2.raftServer->get_leader()\x1b[0m\n",0x35);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15)
          ;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15)
          ;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
          if ((RaftAsioPkg *)local_548._0_8_ != pRVar1) {
            operator_delete((void *)local_548._0_8_);
          }
          iVar5 = -1;
          TestSuite::failHandler();
        }
        else if ((((local_208->leader_).super___atomic_base<int>._M_i == local_208->id_) &&
                 (iVar5 = -1, (local_208->role_)._M_i != leader)) ||
                (iVar5 = (local_208->leader_).super___atomic_base<int>._M_i, iVar5 != 1)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          poVar6 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
          TestSuite::getTimeString_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_548._0_8_,local_548._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
          lVar2 = *(long *)poVar6;
          *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
          poVar13 = poVar6 + *(long *)(lVar2 + -0x18);
          if (poVar6[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
            std::ios::widen((char)poVar13);
            poVar13[0xe1] = (ostream)0x1;
          }
          poVar13[0xe0] = (ostream)0x30;
          local_510._0_8_ = pthread_self();
          std::_Hash_bytes(&local_510,8,0xc70f6907);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
               *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"message_meta_random_denial_test",0x1f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                     ,0x6b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1ea);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"    value of: \x1b[1;34ms3.raftServer->get_leader()\x1b[0m\n",0x35);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15)
          ;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15)
          ;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
          if ((RaftAsioPkg *)local_548._0_8_ != pRVar1) {
            operator_delete((void *)local_548._0_8_);
          }
          iVar5 = -1;
          TestSuite::failHandler();
        }
        else {
          LOCK();
          local_549 = 1;
          UNLOCK();
          __val = 0;
          do {
            cVar8 = '\x01';
            if (9 < __val) {
              uVar7 = __val;
              cVar4 = '\x04';
              do {
                cVar8 = cVar4;
                if (uVar7 < 100) {
                  cVar8 = cVar8 + -2;
                  goto LAB_0018a363;
                }
                if (uVar7 < 1000) {
                  cVar8 = cVar8 + -1;
                  goto LAB_0018a363;
                }
                if (uVar7 < 10000) goto LAB_0018a363;
                bVar3 = 99999 < uVar7;
                uVar7 = uVar7 / 10000;
                cVar4 = cVar8 + '\x04';
              } while (bVar3);
              cVar8 = cVar8 + '\x01';
            }
LAB_0018a363:
            local_548._0_8_ = local_548 + 0x10;
            std::__cxx11::string::_M_construct((ulong)local_548,cVar8);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_548._0_8_,local_548._8_4_,__val);
            nuraft::buffer::alloc((buffer *)local_4a0._M_pod_data,local_548._8_8_ + 4);
            nuraft::buffer_serializer::buffer_serializer
                      (&local_510,(ptr<buffer> *)&local_4a0,LITTLE);
            nuraft::buffer_serializer::put_str(&local_510,(string *)local_548);
            logs._M_i = local_328._M_i;
            local_4b0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_4a0._M_unused._0_8_;
            local_4b0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_4a0._8_8_ + 8) = *(_Atomic_word *)(local_4a0._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_4a0._8_8_ + 8) = *(_Atomic_word *)(local_4a0._8_8_ + 8) + 1;
              }
            }
            __l_00._M_len = 1;
            __l_00._M_array = &local_4b0;
            std::
            vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
            ::vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                      *)(local_3b8 + 0x10),__l_00,&local_511);
            nuraft::raft_server::append_entries
                      ((raft_server *)local_3b8,
                       (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                        *)logs._M_i);
            if ((element_type *)local_3b8._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b8._8_8_);
            }
            std::
            vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
            ::~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                       *)(local_3b8 + 0x10));
            if (local_4b0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_4b0.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a0._8_8_);
            }
            if ((RaftAsioPkg *)local_548._0_8_ != (RaftAsioPkg *)(local_548 + 0x10)) {
              operator_delete((void *)local_548._0_8_);
            }
            __val = __val + 1;
          } while (__val != 100);
          pRVar1 = (RaftAsioPkg *)(local_548 + 0x10);
          local_548._0_8_ = pRVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_548,"wait for random denial","");
          psVar10 = (string *)local_548;
          TestSuite::sleep_sec(5,psVar10);
          iVar9 = (int)psVar10;
          iVar5 = extraout_EDX;
          if ((RaftAsioPkg *)local_548._0_8_ != pRVar1) {
            operator_delete((void *)local_548._0_8_);
            iVar5 = extraout_EDX_00;
          }
          nuraft::raft_server::shutdown((raft_server *)local_328._M_i,iVar9,iVar5);
          nuraft::raft_server::shutdown(local_e8,iVar9,__how);
          nuraft::raft_server::shutdown(local_208,iVar9,__how_00);
          local_548._0_8_ = pRVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"shutting down","");
          psVar10 = (string *)local_548;
          TestSuite::sleep_sec(1,psVar10);
          iVar9 = (int)psVar10;
          pRVar11 = (RaftAsioPkg *)local_548._0_8_;
          if ((RaftAsioPkg *)local_548._0_8_ != pRVar1) {
            operator_delete((void *)local_548._0_8_);
          }
          iVar5 = 0;
          SimpleLogger::shutdown((int)pRVar11,iVar9);
        }
      }
      else {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
        TestSuite::getTimeString_abi_cxx11_();
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(char *)local_548._0_8_,local_548._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
        lVar2 = *(long *)poVar6;
        *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
        *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
        poVar13 = poVar6 + *(long *)(lVar2 + -0x18);
        if (poVar6[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar13);
          poVar13[0xe1] = (ostream)0x1;
        }
        poVar13[0xe0] = (ostream)0x30;
        local_510._0_8_ = pthread_self();
        std::_Hash_bytes(&local_510,8,0xc70f6907);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"message_meta_random_denial_test",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                   ,0x6b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"    value of: \x1b[1;34ms1.raftServer->is_leader()\x1b[0m\n",0x34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"true",4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"false",5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
        if ((RaftAsioPkg *)local_548._0_8_ != pRVar1) {
          operator_delete((void *)local_548._0_8_);
        }
        iVar5 = -1;
        TestSuite::failHandler();
      }
    }
    else {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
      TestSuite::getTimeString_abi_cxx11_();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_548._0_8_,local_548._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
      lVar2 = *(long *)poVar6;
      *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
      poVar13 = poVar6 + *(long *)(lVar2 + -0x18);
      if (poVar6[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar13);
        poVar13[0xe1] = (ostream)0x1;
      }
      poVar13[0xe0] = (ostream)0x30;
      local_510._0_8_ = pthread_self();
      std::_Hash_bytes(&local_510,8,0xc70f6907);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"message_meta_random_denial_test",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                 ,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"    value of: \x1b[1;34mmake_group(pkgs)\x1b[0m\n",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,-1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
      if ((RaftAsioPkg *)local_548._0_8_ != (RaftAsioPkg *)(local_548 + 0x10)) {
        operator_delete((void *)local_548._0_8_);
      }
      iVar5 = -1;
      TestSuite::failHandler();
    }
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_548._0_8_,local_548._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[33m",5);
    lVar2 = *(long *)poVar6;
    *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 4;
    poVar13 = poVar6 + *(long *)(lVar2 + -0x18);
    if (poVar6[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar13);
      poVar13[0xe1] = (ostream)0x1;
    }
    poVar13[0xe0] = (ostream)0x30;
    local_510._0_8_ = pthread_self();
    std::_Hash_bytes(&local_510,8,0xc70f6907);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
         *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"message_meta_random_denial_test",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[1;35m",7);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1e0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"    value of: \x1b[1;34mlaunch_servers(pkgs, false)\x1b[0m\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"      actual: \x1b[1;31m",0x15);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\x1b[0m\n",5);
    if ((RaftAsioPkg *)local_548._0_8_ != (RaftAsioPkg *)(local_548 + 0x10)) {
      operator_delete((void *)local_548._0_8_);
    }
    iVar5 = -1;
    TestSuite::failHandler();
  }
  if (local_490.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_490.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)local_270);
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)local_150);
  RaftAsioPkg::~RaftAsioPkg((RaftAsioPkg *)local_390);
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  return iVar5;
}

Assistant:

int message_meta_random_denial_test() {
    reset_log_files();

    std::string s1_addr = "127.0.0.1:20010";
    std::string s2_addr = "127.0.0.1:20020";
    std::string s3_addr = "127.0.0.1:20030";

    RaftAsioPkg s1(1, s1_addr);
    RaftAsioPkg s2(2, s2_addr);
    RaftAsioPkg s3(3, s3_addr);
    std::vector<RaftAsioPkg*> pkgs = {&s1, &s2, &s3};

    std::atomic<size_t> write_req_cb_count(0);
    std::atomic<size_t> write_resp_cb_count(0);
    std::atomic<bool> start_denial(false);

    _msg("launching asio-raft servers with meta callback\n");
    for (RaftAsioPkg* rr: pkgs) {
        rr->setMetaCallback
            ( std::bind( test_read_meta_random_denial,
                         &start_denial,
                         std::placeholders::_1,
                         std::placeholders::_2 ),
              std::bind( test_write_req_meta,
                         &write_req_cb_count,
                         std::placeholders::_1 ),
              std::bind( test_read_meta_random_denial,
                         &start_denial,
                         std::placeholders::_1,
                         std::placeholders::_2 ),
              std::bind( test_write_resp_meta,
                         &write_resp_cb_count,
                         std::placeholders::_1 ),
              true );
    }
    CHK_Z( launch_servers(pkgs, false) );

    _msg("organizing raft group\n");
    CHK_Z( make_group(pkgs) );

    TestSuite::sleep_sec(1, "wait for Raft group ready");

    CHK_TRUE( s1.raftServer->is_leader() );
    CHK_EQ(1, s1.raftServer->get_leader());
    CHK_EQ(1, s2.raftServer->get_leader());
    CHK_EQ(1, s3.raftServer->get_leader());

    start_denial = true;

    for (size_t ii=0; ii<100; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);
        s1.raftServer->append_entries( {msg} );
    }

    TestSuite::sleep_sec(5, "wait for random denial");

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    return 0;
}